

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprofiletocsv.cpp
# Opt level: O0

void fmprofiletocsv::doit(bool skipheader,bool step)

{
  size_t local_40;
  size_t i;
  uint local_2e;
  fm_profile q;
  bool step_local;
  bool skipheader_local;
  
  q.share2._0_1_ = step;
  q.share2._1_1_ = skipheader;
  if (step) {
    dostep(skipheader);
  }
  else {
    if (!skipheader) {
      printf("profile_id,calcrule_id,deductible1,deductible2,");
      printf("deductible3,attachment1,limit1,share1,share2,");
      printf("share3\n");
    }
    fm_profile::fm_profile((fm_profile *)((long)&i + 6));
    local_40 = fread((void *)((long)&i + 6),0x28,1,_stdin);
    while (local_40 != 0) {
      printf("%d, %d, %f, %f, %f, %f, %f, %f, %f, %f\n",(double)(float)q.profile_id,
             (double)(float)q.calcrule_id,(double)q.deductible1,(double)q.deductible2,
             (double)q.deductible3,(double)q.attachment,(double)q.limit,(double)q.share1,
             (ulong)stack0xffffffffffffffce,(ulong)local_2e);
      local_40 = fread((void *)((long)&i + 6),0x28,1,_stdin);
    }
  }
  return;
}

Assistant:

void doit(bool skipheader, bool step) {
		if (step) {
			dostep(skipheader);
			return;
		}
        if (skipheader == false) {
            printf("profile_id,calcrule_id,deductible1,deductible2,");
            printf("deductible3,attachment1,limit1,share1,share2,");
            printf("share3\n");
        }

        fm_profile q;
        size_t i = fread(&q, sizeof(q), 1, stdin);
        while (i != 0) {
            printf("%d, %d, %f, %f, %f, %f, %f, %f, %f, %f\n", q.profile_id,
                   q.calcrule_id, q.deductible1, q.deductible2, q.deductible3,
                   q.attachment, q.limit, q.share1, q.share2, q.share3);

            i = fread(&q, sizeof(q), 1, stdin);
        }
    }